

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O0

PcodeOp * cseFindInBlock(PcodeOp *op,Varnode *vn,BlockBasic *bl,PcodeOp *earliest)

{
  PcodeOp *this;
  bool bVar1;
  uintm uVar2;
  uintm uVar3;
  int4 iVar4;
  reference ppPVar5;
  BlockBasic *pBVar6;
  SeqNum *pSVar7;
  Varnode *vn1;
  Varnode *vn2;
  Varnode *local_88;
  Varnode *buf2 [2];
  Varnode *buf1 [2];
  Varnode *outvn2;
  Varnode *outvn1;
  PcodeOp *res;
  _List_node_base *local_40;
  _List_const_iterator<PcodeOp_*> local_38;
  const_iterator iter;
  PcodeOp *earliest_local;
  BlockBasic *bl_local;
  Varnode *vn_local;
  PcodeOp *op_local;
  
  iter._M_node = (_List_node_base *)earliest;
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_38);
  local_40 = (_List_node_base *)Varnode::beginDescend(vn);
  local_38._M_node = local_40;
  do {
    res = (PcodeOp *)Varnode::endDescend(vn);
    bVar1 = std::operator!=(&local_38,(_Self *)&res);
    if (!bVar1) {
      return (PcodeOp *)0x0;
    }
    ppPVar5 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_38);
    this = *ppPVar5;
    if ((this != op) && (pBVar6 = PcodeOp::getParent(this), pBVar6 == bl)) {
      if (iter._M_node != (_List_node_base *)0x0) {
        pSVar7 = PcodeOp::getSeqNum((PcodeOp *)iter._M_node);
        uVar2 = SeqNum::getOrder(pSVar7);
        pSVar7 = PcodeOp::getSeqNum(this);
        uVar3 = SeqNum::getOrder(pSVar7);
        if (uVar2 < uVar3) goto LAB_005c3937;
      }
      vn1 = PcodeOp::getOut(op);
      vn2 = PcodeOp::getOut(this);
      if ((vn2 != (Varnode *)0x0) &&
         (iVar4 = functionalEqualityLevel(vn1,vn2,buf2 + 1,&local_88), iVar4 == 0)) {
        return this;
      }
    }
LAB_005c3937:
    std::_List_const_iterator<PcodeOp_*>::operator++(&local_38);
  } while( true );
}

Assistant:

PcodeOp *cseFindInBlock(PcodeOp *op,Varnode *vn,BlockBasic *bl,PcodeOp *earliest)

{
  list<PcodeOp *>::const_iterator iter;
  
  for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
    PcodeOp *res = *iter;
    if (res == op) continue;	// Must not be -op-
    if (res->getParent() != bl) continue; // Must be in -bl-
    if (earliest != (PcodeOp *)0) {
      if (earliest->getSeqNum().getOrder() < res->getSeqNum().getOrder()) continue; // Must occur earlier than earliest
    }
    Varnode *outvn1 = op->getOut();
    Varnode *outvn2 = res->getOut();
    if (outvn2 == (Varnode *)0) continue;
    Varnode *buf1[2];
    Varnode *buf2[2];
    if (functionalEqualityLevel(outvn1,outvn2,buf1,buf2) == 0)
      return res;
  }
  return (PcodeOp *)0;
}